

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31Context.cpp
# Opt level: O0

void __thiscall deqp::gles31::Context::createRenderContext(Context *this)

{
  ApiType apiType;
  Platform *platform;
  CommandLine *cmdLine;
  RenderContext *pRVar1;
  ContextInfo *pCVar2;
  Context *this_local;
  
  platform = tcu::TestContext::getPlatform(this->m_testCtx);
  cmdLine = tcu::TestContext::getCommandLine(this->m_testCtx);
  apiType = glu::ApiType::es(3,2);
  pRVar1 = glu::createDefaultRenderContext(platform,cmdLine,apiType);
  this->m_renderCtx = pRVar1;
  pCVar2 = glu::ContextInfo::create(this->m_renderCtx);
  this->m_contextInfo = pCVar2;
  return;
}

Assistant:

void Context::createRenderContext (void)
{
	DE_ASSERT(!m_renderCtx && !m_contextInfo);

	try
	{
		try
		{
			m_renderCtx		= glu::createDefaultRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), glu::ApiType::es(3, 2));
		}
		catch (...)
		{
			m_renderCtx		= glu::createDefaultRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), glu::ApiType::es(3, 1));
		}
		m_contextInfo	= glu::ContextInfo::create(*m_renderCtx);
	}
	catch (...)
	{
		destroyRenderContext();
		throw;
	}
}